

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  TestLog *pTVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_2>_> *pVVar10;
  pointer pcVar11;
  TestStatus *pTVar12;
  pointer pVVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  _Base_ptr p_Var17;
  long lVar18;
  IVal *pIVar19;
  undefined8 *puVar20;
  uint uVar21;
  ulong size;
  char *pcVar22;
  _Base_ptr p_Var23;
  undefined1 auVar24 [8];
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar25;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  IVal in0;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  float in_stack_fffffffffffffa88;
  _Alloc_hider _Var26;
  size_type local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  IVal local_558;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *local_528;
  TestLog *local_520;
  long local_518;
  long local_510;
  undefined1 local_508 [8];
  _Rb_tree_node_base _Stack_500;
  double dStack_4e0;
  IVal *local_4d8;
  string local_4d0;
  ulong local_4b0;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Rb_tree_node_base *local_488;
  Precision PStack_480;
  undefined4 uStack_47c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [264];
  FloatFormat local_328;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_300;
  TestStatus *local_2d0;
  long local_2c8;
  FloatFormat *local_2c0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_> local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8 [2];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_2d0 = __return_storage_ptr__;
  iVar16 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar16 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa88);
  pVVar13 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  size = (long)local_278.in0.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_278.in0.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_2b8,size);
  local_328.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_300._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_300._M_impl.super__Rb_tree_header._M_header;
  local_300._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_300._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_300._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300._M_impl.super__Rb_tree_header._M_header._M_right =
       local_300._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_520 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2b8.out0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2b8.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_4a8 + 8);
  local_528 = this;
  local_4a8._0_8_ = local_520;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  _Stack_500._0_8_ = (ulong)(uint)_Stack_500._4_4_ << 0x20;
  _Stack_500._M_parent = (_Base_ptr)0x0;
  dStack_4e0 = 0.0;
  pSVar8 = (local_528->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  _Stack_500._M_left = &_Stack_500;
  _Stack_500._M_right = &_Stack_500;
  local_2c0 = pFVar1;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_508);
  if (_Stack_500._M_left != &_Stack_500) {
    p_Var17 = _Stack_500._M_left;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1f8);
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != &_Stack_500);
  }
  if (dStack_4e0 != 0.0) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_520;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_lo);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((double *)local_558.m_data[0]._0_8_ != &local_558.m_data[0].m_hi) {
      operator_delete((void *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_hi + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar9 = (local_528->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_4b0 = size;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,size & 0xffffffff,&local_218,&local_288,0);
  lVar18 = 0x10;
  do {
    local_4d0.field_2._M_local_buf[lVar18 + 8] = '\0';
    *(undefined8 *)((long)&local_4b0 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x40);
  lVar18 = 0x10;
  do {
    local_4d0.field_2._M_local_buf[lVar18 + 8] = '\0';
    *(undefined8 *)((long)&local_4b0 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 == 0x28);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar18) = 0;
    *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x40);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar18) = 0;
    *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 == 0x28);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_518 + lVar18) = 0;
    *(undefined8 *)((long)&local_510 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_508 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x40);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_518 + lVar18) = 0;
    *(undefined8 *)((long)&local_510 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_508 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 == 0x28);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)(local_558.m_data + -1) + 8 + lVar18) = 0;
    *(undefined8 *)((long)(local_558.m_data + -1) + 0x10 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_558.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x40);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)(local_558.m_data + -1) + 8 + lVar18) = 0;
    *(undefined8 *)((long)(local_558.m_data + -1) + 0x10 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_558.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    pBVar25 = local_528;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 == 0x28);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_300,
             (local_528->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_300,
             (pBVar25->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_300,
             (pBVar25->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa88);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_300,
             (pBVar25->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d0);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_300,
             (pBVar25->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_508);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_300,
             (pBVar25->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             &local_558);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar13) {
    local_4d8 = (IVal *)0x0;
  }
  else {
    local_2c8 = local_4b0 + (local_4b0 == 0);
    local_510 = 0;
    local_4d8 = (IVal *)0x0;
    pBVar25 = local_528;
    do {
      pFVar1 = local_2c0;
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar18) = 0;
        *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x40);
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar18) = 0;
        *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 == 0x28);
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_518 + lVar18) = 0;
        *(undefined8 *)((long)&local_510 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_508 + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x40);
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_518 + lVar18) = 0;
        *(undefined8 *)((long)&local_510 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_508 + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 == 0x28);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (&local_558,pFVar1,(Vector<float,_2> *)&stack0xfffffffffffffa88);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,pFVar1,&local_558);
      pIVar19 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_300,
                           (pBVar25->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar19->m_data[1].m_lo = (double)local_488;
      pIVar19->m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      pIVar19->m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      *(ulong *)(pIVar19->m_data + 1) = CONCAT44(local_498._12_4_,local_498._8_4_);
      *(undefined8 *)pIVar19->m_data = local_4a8._0_8_;
      pIVar19->m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      _Var26._M_p = *(pointer *)
                     local_278.in1.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_510].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (&local_558,pFVar1,(Vector<float,_2> *)&stack0xfffffffffffffa88);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,pFVar1,&local_558);
      pIVar19 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_300,
                           (pBVar25->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar19->m_data[1].m_lo = (double)local_488;
      pIVar19->m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      pIVar19->m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      *(ulong *)(pIVar19->m_data + 1) = CONCAT44(local_498._12_4_,local_498._8_4_);
      *(undefined8 *)pIVar19->m_data = local_4a8._0_8_;
      pIVar19->m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_300,
                 (pBVar25->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_300,
                 (pBVar25->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_480 = (pBVar25->m_caseCtx).precision;
      local_488 = (_Rb_tree_node_base *)pFVar1->m_maxValue;
      local_4a8._0_8_ = *(undefined8 *)pFVar1;
      local_4a8._8_4_ = pFVar1->m_fractionBits;
      local_4a8._12_4_ = pFVar1->m_hasSubnormal;
      local_498._M_allocated_capacity._0_4_ = pFVar1->m_hasInf;
      local_498._M_allocated_capacity._4_4_ = pFVar1->m_hasNaN;
      local_498._8_1_ = pFVar1->m_exactPrecision;
      local_498._9_3_ = *(undefined3 *)&pFVar1->field_0x19;
      local_498._12_4_ = *(undefined4 *)&pFVar1->field_0x1c;
      local_470 = 0;
      pSVar8 = (pBVar25->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = &local_300;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_4a8);
      pIVar19 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_300,
                           (pBVar25->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar19);
      _Stack_500._0_8_ = CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      _Stack_500._M_parent =
           (_Base_ptr)
           CONCAT44(local_498._M_allocated_capacity._4_4_,local_498._M_allocated_capacity._0_4_);
      _Stack_500._M_left = (_Base_ptr)CONCAT44(local_498._12_4_,local_498._8_4_);
      dStack_4e0 = (double)CONCAT44(uStack_47c,PStack_480);
      _Stack_500._M_right = local_488;
      local_508 = (undefined1  [8])local_4a8._0_8_;
      local_518 = local_510 * 8;
      bVar14 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         ((IVal *)local_508,
                          local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_510);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_80,bVar14,(string *)local_4a8);
      pBVar25 = local_528;
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      pIVar19 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_300,
                           (pBVar25->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar19);
      local_1f8[0].m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      local_1f8[0].m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      local_1f8[0].m_data[1]._4_4_ = local_498._12_4_;
      local_1f8[0].m_data[1]._0_4_ = local_498._8_4_;
      local_1f8[0].m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      local_1f8[0].m_data[1].m_lo = (double)local_488;
      local_1f8[0].m_data[0]._0_8_ = local_4a8._0_8_;
      bVar15 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         (local_1f8,
                          (Vector<float,_2> *)
                          ((long)(local_2b8.out0.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518));
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_80,bVar15,(string *)local_4a8);
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      pBVar25 = local_528;
      uVar21 = (int)local_4d8 + ((byte)~(bVar14 && bVar15) & 1);
      pIVar19 = (IVal *)(ulong)uVar21;
      local_4d8 = pIVar19;
      if ((int)uVar21 < 0x65 && (!bVar14 || !bVar15)) {
        local_4a8._0_8_ = local_520;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4a8 + 8));
        pcVar22 = "Failed";
        if (bVar14 && bVar15) {
          pcVar22 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),pcVar22,6);
        pdVar2 = &local_558.m_data[0].m_hi;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8)," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar10 = (pBVar25->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558.m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_558.m_data[0]._0_8_,
                   (long)local_558.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                   (Vector<float,_2> *)pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),_Var26._M_p,local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_568) {
          operator_delete(_Var26._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((double *)local_558.m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar10 = (pBVar25->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558.m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_558.m_data[0]._0_8_,
                   (long)local_558.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)(local_278.in1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                   (Vector<float,_2> *)pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),_Var26._M_p,local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_568) {
          operator_delete(_Var26._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((double *)local_558.m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar10 = (pBVar25->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558.m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_558.m_data[0]._0_8_,
                   (long)local_558.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)(local_2b8.out0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                   (Vector<float,_2> *)pIVar19);
        poVar4 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var26._M_p,local_570);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4d0,(shaderexecutor *)&local_328,(FloatFormat *)local_1f8,pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),local_4d0._M_dataplus._M_p,local_4d0._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_568) {
          operator_delete(_Var26._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((double *)local_558.m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar10 = (pBVar25->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558.m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_558.m_data[0]._0_8_,
                   (long)local_558.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)(local_2b8.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                   (Vector<float,_2> *)pIVar19);
        poVar4 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var26._M_p,local_570);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4d0,(shaderexecutor *)&local_328,(FloatFormat *)local_508,pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_568) {
          operator_delete(_Var26._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((double *)local_558.m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_558.m_data[0]._0_8_,(long)local_558.m_data[0].m_hi + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4a8 + 8));
        std::ios_base::~ios_base(local_430);
      }
      local_510 = local_510 + 1;
    } while (local_510 != local_2c8);
  }
  pTVar12 = local_2d0;
  iVar16 = (int)local_4d8;
  if (100 < iVar16) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_520;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar16 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  poVar3 = (ostringstream *)(local_4a8 + 8);
  if (iVar16 == 0) {
    local_4a8._0_8_ = local_520;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a8._0_8_ = local_520;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  if (iVar16 == 0) {
    local_4a8._0_8_ = (TestLog *)(local_4a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar12->m_code = QP_TEST_RESULT_PASS;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_4a8._0_8_,
               (pointer)(local_4a8._0_8_ + CONCAT44(local_4a8._12_4_,local_4a8._8_4_)));
    if ((TestLog *)local_4a8._0_8_ == (TestLog *)(local_4a8 + 0x10)) goto LAB_008af819;
    p_Var17 = (_Base_ptr)
              CONCAT44(local_498._M_allocated_capacity._4_4_,local_498._M_allocated_capacity._0_4_);
    auVar24 = (undefined1  [8])local_4a8._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar16);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    pTVar5 = (TestLog *)(local_4a8 + 0x10);
    local_4a8._0_8_ = pTVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    p_Var17 = (_Base_ptr)(CONCAT44(local_4a8._12_4_,local_4a8._8_4_) + _Stack_500._0_8_);
    p_Var23 = (_Base_ptr)0xf;
    if (local_508 != (undefined1  [8])&_Stack_500._M_parent) {
      p_Var23 = _Stack_500._M_parent;
    }
    if (p_Var23 < p_Var17) {
      p_Var23 = (_Base_ptr)0xf;
      if ((TestLog *)local_4a8._0_8_ != pTVar5) {
        p_Var23 = (_Base_ptr)
                  CONCAT44(local_498._M_allocated_capacity._4_4_,
                           local_498._M_allocated_capacity._0_4_);
      }
      if (p_Var23 < p_Var17) goto LAB_008af6ab;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,(ulong)local_508);
    }
    else {
LAB_008af6ab:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_508,local_4a8._0_8_);
    }
    local_1f8[0].m_data[0]._0_8_ = &local_1f8[0].m_data[0].m_hi;
    pdVar2 = (double *)(puVar20 + 2);
    if ((double *)*puVar20 == pdVar2) {
      local_1f8[0].m_data[0].m_hi = *pdVar2;
      local_1f8[0].m_data[1]._0_8_ = puVar20[3];
    }
    else {
      local_1f8[0].m_data[0].m_hi = *pdVar2;
      local_1f8[0].m_data[0]._0_8_ = (double *)*puVar20;
    }
    local_1f8[0].m_data[0].m_lo = (double)puVar20[1];
    *puVar20 = pdVar2;
    puVar20[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    pTVar12->m_code = QP_TEST_RESULT_FAIL;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_1f8[0].m_data[0]._0_8_,
               (undefined1 *)(local_1f8[0].m_data[0]._0_8_ + (long)local_1f8[0].m_data[0].m_lo));
    if ((double *)local_1f8[0].m_data[0]._0_8_ != &local_1f8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1);
    }
    if ((TestLog *)local_4a8._0_8_ != pTVar5) {
      operator_delete((void *)local_4a8._0_8_,
                      CONCAT44(local_498._M_allocated_capacity._4_4_,
                               local_498._M_allocated_capacity._0_4_) + 1);
    }
    p_Var17 = _Stack_500._M_parent;
    auVar24 = local_508;
    if (local_508 == (undefined1  [8])&_Stack_500._M_parent) goto LAB_008af819;
  }
  operator_delete((void *)auVar24,(ulong)((long)&p_Var17->_M_color + 1));
LAB_008af819:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_300);
  if (local_2b8.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar12;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}